

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_import(__mpz_struct *r,size_t count,int order,size_t size,int endian,size_t nails,void *src
               )

{
  long lVar1;
  mp_srcptr xp;
  mp_size_t mVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  byte *pbVar10;
  bool bVar11;
  
  if (nails == 0) {
    uVar4 = -(uint)(endian == 0) | endian;
    lVar3 = size * 2;
    if (uVar4 == order) {
      lVar3 = 0;
    }
    lVar9 = -lVar3;
    lVar7 = (count - 1) * size;
    if (order != 1) {
      lVar9 = lVar3;
      lVar7 = 0;
    }
    pbVar10 = (byte *)(lVar7 + (long)src) + (size - 1);
    if (uVar4 != 1) {
      pbVar10 = (byte *)(lVar7 + (long)src);
    }
    uVar6 = size * count + 7 >> 3;
    if ((long)r->_mp_alloc < (long)uVar6) {
      xp = mpz_realloc(r,uVar6);
    }
    else {
      xp = r->_mp_d;
    }
    uVar6 = 0;
    lVar3 = 0;
    lVar7 = 0;
    while (bVar11 = count != 0, count = count - 1, sVar8 = size, bVar11) {
      while (sVar8 != 0) {
        lVar1 = lVar3 + 1;
        uVar6 = (ulong)*pbVar10 << ((byte)((int)lVar3 << 3) & 0x3f) | uVar6;
        lVar3 = lVar1;
        if (lVar1 == 8) {
          xp[lVar7] = uVar6;
          lVar7 = lVar7 + 1;
          uVar6 = 0;
          lVar3 = 0;
        }
        pbVar10 = pbVar10 + -(long)(int)uVar4;
        sVar8 = sVar8 - 1;
      }
      pbVar10 = pbVar10 + lVar9;
    }
    if (uVar6 == 0) {
      mVar2 = mpn_normalized_size(xp,lVar7);
      iVar5 = (int)mVar2;
    }
    else {
      xp[lVar7] = uVar6;
      iVar5 = (int)lVar7 + 1;
    }
    r->_mp_size = iVar5;
    return;
  }
  gmp_die("mpz_import: Nails not supported.");
}

Assistant:

void
mpz_import (mpz_t r, size_t count, int order, size_t size, int endian,
	    size_t nails, const void *src)
{
  const unsigned char *p;
  ptrdiff_t word_step;
  mp_ptr rp;
  mp_size_t rn;

  /* The current (partial) limb. */
  mp_limb_t limb;
  /* The number of bytes already copied to this limb (starting from
     the low end). */
  size_t bytes;
  /* The index where the limb should be stored, when completed. */
  mp_size_t i;

  if (nails != 0)
    gmp_die ("mpz_import: Nails not supported.");

  assert (order == 1 || order == -1);
  assert (endian >= -1 && endian <= 1);

  if (endian == 0)
    endian = gmp_detect_endian ();

  p = (unsigned char *) src;

  word_step = (order != endian) ? 2 * size : 0;

  /* Process bytes from the least significant end, so point p at the
     least significant word. */
  if (order == 1)
    {
      p += size * (count - 1);
      word_step = - word_step;
    }

  /* And at least significant byte of that word. */
  if (endian == 1)
    p += (size - 1);

  rn = (size * count + sizeof(mp_limb_t) - 1) / sizeof(mp_limb_t);
  rp = MPZ_REALLOC (r, rn);

  for (limb = 0, bytes = 0, i = 0; count > 0; count--, p += word_step)
    {
      size_t j;
      for (j = 0; j < size; j++, p -= (ptrdiff_t) endian)
	{
	  limb |= (mp_limb_t) *p << (bytes++ * CHAR_BIT);
	  if (bytes == sizeof(mp_limb_t))
	    {
	      rp[i++] = limb;
	      bytes = 0;
	      limb = 0;
	    }
	}
    }
  assert (i + (bytes > 0) == rn);
  if (limb != 0)
    rp[i++] = limb;
  else
    i = mpn_normalized_size (rp, i);

  r->_mp_size = i;
}